

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.h
# Opt level: O3

Vertex * Assimp::Vertex::BinaryOp<std::plus>(Vertex *__return_storage_ptr__,Vertex *v0,Vertex *v1)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  long lVar24;
  
  lVar24 = 0;
  memset(__return_storage_ptr__->texcoords,0,0xe0);
  uVar4 = (v0->position).x;
  uVar16 = (v0->position).y;
  uVar5 = (v1->position).x;
  uVar17 = (v1->position).y;
  fVar2 = (v0->position).z;
  fVar3 = (v1->position).z;
  (__return_storage_ptr__->position).x = (float)uVar5 + (float)uVar4;
  (__return_storage_ptr__->position).y = (float)uVar17 + (float)uVar16;
  (__return_storage_ptr__->position).z = fVar2 + fVar3;
  uVar6 = (v0->normal).x;
  uVar18 = (v0->normal).y;
  uVar7 = (v1->normal).x;
  uVar19 = (v1->normal).y;
  fVar2 = (v0->normal).z;
  fVar3 = (v1->normal).z;
  (__return_storage_ptr__->normal).x = (float)uVar7 + (float)uVar6;
  (__return_storage_ptr__->normal).y = (float)uVar19 + (float)uVar18;
  (__return_storage_ptr__->normal).z = fVar2 + fVar3;
  uVar8 = (v0->tangent).x;
  uVar20 = (v0->tangent).y;
  uVar9 = (v1->tangent).x;
  uVar21 = (v1->tangent).y;
  fVar2 = (v0->tangent).z;
  fVar3 = (v1->tangent).z;
  (__return_storage_ptr__->tangent).x = (float)uVar9 + (float)uVar8;
  (__return_storage_ptr__->tangent).y = (float)uVar21 + (float)uVar20;
  (__return_storage_ptr__->tangent).z = fVar2 + fVar3;
  uVar10 = (v0->bitangent).x;
  uVar22 = (v0->bitangent).y;
  uVar11 = (v1->bitangent).x;
  uVar23 = (v1->bitangent).y;
  fVar2 = (v0->bitangent).z;
  fVar3 = (v1->bitangent).z;
  (__return_storage_ptr__->bitangent).x = (float)uVar11 + (float)uVar10;
  (__return_storage_ptr__->bitangent).y = (float)uVar23 + (float)uVar22;
  (__return_storage_ptr__->bitangent).z = fVar2 + fVar3;
  do {
    uVar12 = *(undefined8 *)((long)&v0->texcoords[0].x + lVar24);
    uVar13 = *(undefined8 *)((long)&v1->texcoords[0].x + lVar24);
    fVar2 = *(float *)((long)&v0->texcoords[0].z + lVar24);
    fVar3 = *(float *)((long)&v1->texcoords[0].z + lVar24);
    *(ulong *)((long)&__return_storage_ptr__->texcoords[0].x + lVar24) =
         CONCAT44((float)((ulong)uVar13 >> 0x20) + (float)((ulong)uVar12 >> 0x20),
                  (float)uVar13 + (float)uVar12);
    *(float *)((long)&__return_storage_ptr__->texcoords[0].z + lVar24) = fVar2 + fVar3;
    lVar24 = lVar24 + 0xc;
  } while (lVar24 != 0x60);
  lVar24 = 0;
  do {
    uVar12 = *(undefined8 *)((long)&v0->colors[0].r + lVar24);
    uVar13 = *(undefined8 *)((long)&v0->colors[0].b + lVar24);
    uVar14 = *(undefined8 *)((long)&v1->colors[0].r + lVar24);
    uVar15 = *(undefined8 *)((long)&v1->colors[0].b + lVar24);
    pfVar1 = (float *)((long)&__return_storage_ptr__->colors[0].r + lVar24);
    *pfVar1 = (float)uVar14 + (float)uVar12;
    pfVar1[1] = (float)((ulong)uVar14 >> 0x20) + (float)((ulong)uVar12 >> 0x20);
    pfVar1[2] = (float)uVar15 + (float)uVar13;
    pfVar1[3] = (float)((ulong)uVar15 >> 0x20) + (float)((ulong)uVar13 >> 0x20);
    lVar24 = lVar24 + 0x10;
  } while (lVar24 != 0x80);
  return __return_storage_ptr__;
}

Assistant:

static Vertex BinaryOp(const Vertex& v0, const Vertex& v1) {
        // this is a heavy task for the compiler to optimize ... *pray*

        Vertex res;
        res.position  = op<aiVector3D>()(v0.position,v1.position);
        res.normal    = op<aiVector3D>()(v0.normal,v1.normal);
        res.tangent   = op<aiVector3D>()(v0.tangent,v1.tangent);
        res.bitangent = op<aiVector3D>()(v0.bitangent,v1.bitangent);

        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
            res.texcoords[i] = op<aiVector3D>()(v0.texcoords[i],v1.texcoords[i]);
        }
        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i) {
            res.colors[i] = op<aiColor4D>()(v0.colors[i],v1.colors[i]);
        }
        return res;
    }